

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t zeGetKernelProcAddrTable(ze_api_version_t version,ze_kernel_dditable_t *pDdiTable)

{
  ze_result_t result;
  ze_kernel_dditable_t *dditable;
  ze_kernel_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  if (pDdiTable == (ze_kernel_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)tracing_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
    DAT_002da790 = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate = tracing_layer::zeKernelCreate;
    DAT_002da798 = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy = tracing_layer::zeKernelDestroy;
    DAT_002da7a0 = pDdiTable->pfnSetCacheConfig;
    pDdiTable->pfnSetCacheConfig = tracing_layer::zeKernelSetCacheConfig;
    DAT_002da7a8 = pDdiTable->pfnSetGroupSize;
    pDdiTable->pfnSetGroupSize = tracing_layer::zeKernelSetGroupSize;
    DAT_002da7b0 = pDdiTable->pfnSuggestGroupSize;
    pDdiTable->pfnSuggestGroupSize = tracing_layer::zeKernelSuggestGroupSize;
    DAT_002da7b8 = pDdiTable->pfnSuggestMaxCooperativeGroupCount;
    pDdiTable->pfnSuggestMaxCooperativeGroupCount =
         tracing_layer::zeKernelSuggestMaxCooperativeGroupCount;
    DAT_002da7c0 = pDdiTable->pfnSetArgumentValue;
    pDdiTable->pfnSetArgumentValue = tracing_layer::zeKernelSetArgumentValue;
    DAT_002da7c8 = pDdiTable->pfnSetIndirectAccess;
    pDdiTable->pfnSetIndirectAccess = tracing_layer::zeKernelSetIndirectAccess;
    DAT_002da7d0 = pDdiTable->pfnGetIndirectAccess;
    pDdiTable->pfnGetIndirectAccess = tracing_layer::zeKernelGetIndirectAccess;
    DAT_002da7d8 = pDdiTable->pfnGetSourceAttributes;
    pDdiTable->pfnGetSourceAttributes = tracing_layer::zeKernelGetSourceAttributes;
    DAT_002da7e0 = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties = tracing_layer::zeKernelGetProperties;
    DAT_002da7e8 = pDdiTable->pfnGetName;
    pDdiTable->pfnGetName = tracing_layer::zeKernelGetName;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetKernelProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_kernel_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.Kernel;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = tracing_layer::zeKernelCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = tracing_layer::zeKernelDestroy;

    dditable.pfnSetCacheConfig                           = pDdiTable->pfnSetCacheConfig;
    pDdiTable->pfnSetCacheConfig                         = tracing_layer::zeKernelSetCacheConfig;

    dditable.pfnSetGroupSize                             = pDdiTable->pfnSetGroupSize;
    pDdiTable->pfnSetGroupSize                           = tracing_layer::zeKernelSetGroupSize;

    dditable.pfnSuggestGroupSize                         = pDdiTable->pfnSuggestGroupSize;
    pDdiTable->pfnSuggestGroupSize                       = tracing_layer::zeKernelSuggestGroupSize;

    dditable.pfnSuggestMaxCooperativeGroupCount          = pDdiTable->pfnSuggestMaxCooperativeGroupCount;
    pDdiTable->pfnSuggestMaxCooperativeGroupCount        = tracing_layer::zeKernelSuggestMaxCooperativeGroupCount;

    dditable.pfnSetArgumentValue                         = pDdiTable->pfnSetArgumentValue;
    pDdiTable->pfnSetArgumentValue                       = tracing_layer::zeKernelSetArgumentValue;

    dditable.pfnSetIndirectAccess                        = pDdiTable->pfnSetIndirectAccess;
    pDdiTable->pfnSetIndirectAccess                      = tracing_layer::zeKernelSetIndirectAccess;

    dditable.pfnGetIndirectAccess                        = pDdiTable->pfnGetIndirectAccess;
    pDdiTable->pfnGetIndirectAccess                      = tracing_layer::zeKernelGetIndirectAccess;

    dditable.pfnGetSourceAttributes                      = pDdiTable->pfnGetSourceAttributes;
    pDdiTable->pfnGetSourceAttributes                    = tracing_layer::zeKernelGetSourceAttributes;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = tracing_layer::zeKernelGetProperties;

    dditable.pfnGetName                                  = pDdiTable->pfnGetName;
    pDdiTable->pfnGetName                                = tracing_layer::zeKernelGetName;

    return result;
}